

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3833::Calc_Sxi_xi_compact
          (ChElementShellANCF_3833 *this,VectorN *Sxi_xi_compact,double xi,double eta,double zeta,
          double thickness,double zoffset)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar58 [64];
  undefined8 in_XMM2_Qb;
  undefined8 in_XMM3_Qb;
  undefined8 in_XMM4_Qb;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  double dVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  double dVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  
  auVar58._8_56_ = in_register_00001248;
  auVar58._0_8_ = eta;
  auVar56._8_56_ = in_register_00001208;
  auVar56._0_8_ = xi;
  dVar2 = eta + -1.0;
  auVar55 = auVar56._0_16_;
  auVar54 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar55,auVar58._0_16_);
  dVar77 = auVar54._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0] = dVar77 * dVar2 * -0.25;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = this->m_thicknessZ;
  auVar60 = ZEXT816(0xc000000000000000);
  auVar36._8_8_ = in_XMM4_Qb;
  auVar36._0_8_ = zoffset;
  auVar52 = vfmadd231sd_fma(auVar67,auVar36,auVar60);
  auVar54 = vfmadd213sd_fma(auVar60,auVar55,auVar58._0_16_);
  dVar3 = eta + 1.0;
  auVar53._8_8_ = in_XMM2_Qb;
  auVar53._0_8_ = zeta;
  auVar17._8_8_ = in_XMM3_Qb;
  auVar17._0_8_ = thickness;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = auVar52._0_8_ - thickness;
  auVar52 = vfnmadd231sd_fma(auVar68,auVar17,auVar53);
  dVar84 = auVar54._0_8_;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[1] = dVar77 * dVar2 * 0.125 * auVar52._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = this->m_thicknessZ;
  auVar37._8_8_ = in_XMM4_Qb;
  auVar37._0_8_ = zoffset;
  auVar52 = vfmadd231sd_fma(auVar63,auVar37,auVar60);
  auVar4._8_8_ = in_XMM2_Qb;
  auVar4._0_8_ = zeta;
  auVar18._8_8_ = in_XMM3_Qb;
  auVar18._0_8_ = thickness;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = auVar52._0_8_ - thickness;
  auVar52 = vfnmadd231sd_fma(auVar64,auVar18,auVar4);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[2] = dVar77 * auVar52._0_8_ * auVar52._0_8_ * -0.03125 * dVar2;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[3] = dVar84 * dVar2 * 0.25;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar2;
  auVar52 = vmulsd_avx512f(auVar59,ZEXT816(0xbfc0000000000000));
  auVar38._8_8_ = in_XMM4_Qb;
  auVar38._0_8_ = zoffset;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = this->m_thicknessZ;
  auVar53 = vfmadd231sd_avx512f(auVar90,auVar38,auVar60);
  auVar52 = vmulsd_avx512f(auVar54,auVar52);
  auVar19._8_8_ = in_XMM3_Qb;
  auVar19._0_8_ = thickness;
  auVar53 = vsubsd_avx512f(auVar53,auVar19);
  auVar5._8_8_ = in_XMM2_Qb;
  auVar5._0_8_ = zeta;
  auVar20._8_8_ = in_XMM3_Qb;
  auVar20._0_8_ = thickness;
  auVar53 = vfnmadd231sd_avx512f(auVar53,auVar20,auVar5);
  auVar52 = vmulsd_avx512f(auVar52,auVar53);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).
           m_storage.m_data.array + 4;
  vmovsd_avx512f(auVar52);
  *pdVar1 = *pdVar1;
  auVar39._8_8_ = in_XMM4_Qb;
  auVar39._0_8_ = zoffset;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = this->m_thicknessZ;
  auVar52 = vfmadd231sd_avx512f(auVar88,auVar39,auVar60);
  auVar21._8_8_ = in_XMM3_Qb;
  auVar21._0_8_ = thickness;
  auVar52 = vsubsd_avx512f(auVar52,auVar21);
  auVar6._8_8_ = in_XMM2_Qb;
  auVar6._0_8_ = zeta;
  auVar22._8_8_ = in_XMM3_Qb;
  auVar22._0_8_ = thickness;
  auVar52 = vfnmadd231sd_avx512f(auVar52,auVar22,auVar6);
  auVar53 = vmulsd_avx512f(auVar52,ZEXT816(0x3fa0000000000000));
  auVar52 = vmulsd_avx512f(auVar52,auVar53);
  auVar52 = vmulsd_avx512f(auVar59,auVar52);
  auVar54 = vmulsd_avx512f(auVar54,auVar52);
  pdVar1 = (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).
           m_storage.m_data.array + 5;
  vmovsd_avx512f(auVar54);
  *pdVar1 = *pdVar1;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[6] = dVar77 * dVar3 * 0.25;
  auVar40._8_8_ = in_XMM4_Qb;
  auVar40._0_8_ = zoffset;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = this->m_thicknessZ;
  auVar54 = vfmadd231sd_avx512f(auVar89,auVar40,auVar60);
  auVar23._8_8_ = in_XMM3_Qb;
  auVar23._0_8_ = thickness;
  auVar54 = vsubsd_avx512f(auVar54,auVar23);
  auVar7._8_8_ = in_XMM2_Qb;
  auVar7._0_8_ = zeta;
  auVar24._8_8_ = in_XMM3_Qb;
  auVar24._0_8_ = thickness;
  auVar54 = vfnmadd231sd_avx512f(auVar54,auVar24,auVar7);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar77 * dVar3 * -0.125;
  auVar54 = vmulsd_avx512f(auVar85,auVar54);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[7] = auVar54._0_8_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = this->m_thicknessZ;
  auVar41._8_8_ = in_XMM4_Qb;
  auVar41._0_8_ = zoffset;
  auVar54 = vfmadd231sd_fma(auVar86,auVar41,auVar60);
  auVar8._8_8_ = in_XMM2_Qb;
  auVar8._0_8_ = zeta;
  auVar25._8_8_ = in_XMM3_Qb;
  auVar25._0_8_ = thickness;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = auVar54._0_8_ - thickness;
  auVar54 = vfnmadd231sd_fma(auVar87,auVar25,auVar8);
  auVar52 = vmulsd_avx512f(auVar54,ZEXT816(0x3fa0000000000000));
  auVar54 = vmulsd_avx512f(auVar54,auVar52);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[8] = dVar77 * auVar54._0_8_ * dVar3;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[9] = dVar84 * dVar3 * -0.25;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = this->m_thicknessZ;
  auVar42._8_8_ = in_XMM4_Qb;
  auVar42._0_8_ = zoffset;
  auVar54 = vfmadd231sd_fma(auVar78,auVar42,auVar60);
  auVar9._8_8_ = in_XMM2_Qb;
  auVar9._0_8_ = zeta;
  auVar26._8_8_ = in_XMM3_Qb;
  auVar26._0_8_ = thickness;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = auVar54._0_8_ - thickness;
  auVar54 = vfnmadd231sd_fma(auVar79,auVar26,auVar9);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[10] = dVar84 * dVar3 * 0.125 * auVar54._0_8_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = this->m_thicknessZ;
  auVar43._8_8_ = in_XMM4_Qb;
  auVar43._0_8_ = zoffset;
  auVar54 = vfmadd231sd_fma(auVar73,auVar43,auVar60);
  auVar10._8_8_ = in_XMM2_Qb;
  auVar10._0_8_ = zeta;
  auVar27._8_8_ = in_XMM3_Qb;
  auVar27._0_8_ = thickness;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = auVar54._0_8_ - thickness;
  auVar54 = vfnmadd231sd_fma(auVar74,auVar27,auVar10);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0xb] = dVar84 * auVar54._0_8_ * auVar54._0_8_ * -0.03125 * dVar3;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0xc] = dVar2 * xi;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = this->m_thicknessZ;
  auVar44._8_8_ = in_XMM4_Qb;
  auVar44._0_8_ = zoffset;
  auVar54 = vfmadd231sd_fma(auVar82,auVar44,auVar60);
  auVar11._8_8_ = in_XMM2_Qb;
  auVar11._0_8_ = zeta;
  auVar28._8_8_ = in_XMM3_Qb;
  auVar28._0_8_ = thickness;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = auVar54._0_8_ - thickness;
  auVar54 = vfnmadd231sd_fma(auVar83,auVar28,auVar11);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0xd] = xi * -0.5 * dVar2 * auVar54._0_8_;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = this->m_thicknessZ;
  auVar45._8_8_ = in_XMM4_Qb;
  auVar45._0_8_ = zoffset;
  auVar54 = vfmadd231sd_fma(auVar80,auVar45,auVar60);
  auVar12._8_8_ = in_XMM2_Qb;
  auVar12._0_8_ = zeta;
  auVar29._8_8_ = in_XMM3_Qb;
  auVar29._0_8_ = thickness;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = auVar54._0_8_ - thickness;
  auVar54 = vfnmadd231sd_fma(auVar81,auVar29,auVar12);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0xe] = auVar54._0_8_ * xi * 0.125 * auVar54._0_8_ * dVar2;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0xf] = dVar2 * -0.5 * dVar3;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = this->m_thicknessZ;
  auVar46._8_8_ = in_XMM4_Qb;
  auVar46._0_8_ = zoffset;
  auVar54 = vfmadd231sd_fma(auVar69,auVar46,auVar60);
  auVar13._8_8_ = in_XMM2_Qb;
  auVar13._0_8_ = zeta;
  auVar30._8_8_ = in_XMM3_Qb;
  auVar30._0_8_ = thickness;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = auVar54._0_8_ - thickness;
  auVar54 = vfnmadd231sd_fma(auVar70,auVar30,auVar13);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0x10] = dVar2 * 0.25 * dVar3 * auVar54._0_8_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = this->m_thicknessZ;
  auVar47._8_8_ = in_XMM4_Qb;
  auVar47._0_8_ = zoffset;
  auVar54 = vfmadd231sd_fma(auVar71,auVar47,auVar60);
  auVar14._8_8_ = in_XMM2_Qb;
  auVar14._0_8_ = zeta;
  auVar31._8_8_ = in_XMM3_Qb;
  auVar31._0_8_ = thickness;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = auVar54._0_8_ - thickness;
  auVar54 = vfnmadd231sd_fma(auVar72,auVar31,auVar14);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0x11] = auVar54._0_8_ * dVar2 * -0.0625 * dVar3 * auVar54._0_8_;
  auVar52._8_8_ = 0x8000000000000000;
  auVar52._0_8_ = 0x8000000000000000;
  auVar54 = vxorpd_avx512vl(auVar55,auVar52);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0x12] = auVar54._0_8_ * dVar3;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = this->m_thicknessZ;
  auVar48._8_8_ = in_XMM4_Qb;
  auVar48._0_8_ = zoffset;
  auVar54 = vfmadd231sd_fma(auVar75,auVar48,auVar60);
  auVar55._8_8_ = in_XMM2_Qb;
  auVar55._0_8_ = zeta;
  auVar32._8_8_ = in_XMM3_Qb;
  auVar32._0_8_ = thickness;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = auVar54._0_8_ - thickness;
  auVar54 = vfnmadd231sd_fma(auVar76,auVar32,auVar55);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0x13] = xi * 0.5 * dVar3 * auVar54._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = this->m_thicknessZ;
  auVar49._8_8_ = in_XMM4_Qb;
  auVar49._0_8_ = zoffset;
  auVar54 = vfmadd231sd_fma(auVar65,auVar49,auVar60);
  auVar15._8_8_ = in_XMM2_Qb;
  auVar15._0_8_ = zeta;
  auVar33._8_8_ = in_XMM3_Qb;
  auVar33._0_8_ = thickness;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = auVar54._0_8_ - thickness;
  auVar54 = vfnmadd231sd_fma(auVar66,auVar33,auVar15);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0x14] = dVar3 * auVar54._0_8_ * auVar54._0_8_ * xi * -0.125;
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0x15] = dVar3 * dVar2 * 0.5;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = this->m_thicknessZ;
  auVar50._8_8_ = in_XMM4_Qb;
  auVar50._0_8_ = zoffset;
  auVar54 = vfmadd231sd_fma(auVar61,auVar50,auVar60);
  auVar16._8_8_ = in_XMM2_Qb;
  auVar16._0_8_ = zeta;
  auVar34._8_8_ = in_XMM3_Qb;
  auVar34._0_8_ = thickness;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = auVar54._0_8_ - thickness;
  auVar54 = vfnmadd231sd_fma(auVar62,auVar34,auVar16);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0x16] = dVar3 * dVar2 * -0.25 * auVar54._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = this->m_thicknessZ;
  auVar51._8_8_ = in_XMM4_Qb;
  auVar51._0_8_ = zoffset;
  auVar54 = vfmadd213sd_fma(auVar60,auVar51,auVar54);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = auVar54._0_8_ - thickness;
  auVar60._8_8_ = in_XMM2_Qb;
  auVar60._0_8_ = zeta;
  auVar35._8_8_ = in_XMM3_Qb;
  auVar35._0_8_ = thickness;
  auVar54 = vfnmadd231sd_fma(auVar57,auVar35,auVar60);
  (Sxi_xi_compact->super_PlainObjectBase<Eigen::Matrix<double,_24,_1,_0,_24,_1>_>).m_storage.m_data.
  array[0x17] = auVar54._0_8_ * dVar3 * dVar2 * 0.0625 * auVar54._0_8_;
  return;
}

Assistant:

void ChElementShellANCF_3833::Calc_Sxi_xi_compact(VectorN& Sxi_xi_compact,
                                                  double xi,
                                                  double eta,
                                                  double zeta,
                                                  double thickness,
                                                  double zoffset) {
    Sxi_xi_compact(0) = (-0.25) * (eta - 1) * (eta + 2 * xi);
    Sxi_xi_compact(1) =
        (0.125) * (eta - 1) * (eta + 2 * xi) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);
    Sxi_xi_compact(2) = (-0.03125) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) *
                        (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) * (eta - 1) * (eta + 2 * xi);
    Sxi_xi_compact(3) = (0.25) * (eta - 1) * (eta - 2 * xi);
    Sxi_xi_compact(4) =
        (-0.125) * (eta - 1) * (eta - 2 * xi) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);
    Sxi_xi_compact(5) = (0.03125) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) *
                        (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) * (eta - 1) * (eta - 2 * xi);
    Sxi_xi_compact(6) = (0.25) * (eta + 1) * (eta + 2 * xi);
    Sxi_xi_compact(7) =
        (-0.125) * (eta + 1) * (eta + 2 * xi) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);
    Sxi_xi_compact(8) = (0.03125) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) *
                        (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) * (eta + 1) * (eta + 2 * xi);
    Sxi_xi_compact(9) = (-0.25) * (eta + 1) * (eta - 2 * xi);
    Sxi_xi_compact(10) =
        (0.125) * (eta + 1) * (eta - 2 * xi) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);
    Sxi_xi_compact(11) = (-0.03125) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) *
                         (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) * (eta + 1) * (eta - 2 * xi);
    Sxi_xi_compact(12) = (xi) * (eta - 1);
    Sxi_xi_compact(13) = (-0.5) * (xi) * (eta - 1) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);
    Sxi_xi_compact(14) = (0.125) * (xi) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) *
                         (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) * (eta - 1);
    Sxi_xi_compact(15) = (-0.5) * (eta - 1) * (eta + 1);
    Sxi_xi_compact(16) = (0.25) * (eta - 1) * (eta + 1) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);
    Sxi_xi_compact(17) = (-0.0625) * (eta - 1) * (eta + 1) *
                         (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) *
                         (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);
    Sxi_xi_compact(18) = (-1) * (xi) * (eta + 1);
    Sxi_xi_compact(19) = (0.5) * (xi) * (eta + 1) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);
    Sxi_xi_compact(20) = (-0.125) * (xi) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) *
                         (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) * (eta + 1);
    Sxi_xi_compact(21) = (0.5) * (eta - 1) * (eta + 1);
    Sxi_xi_compact(22) = (-0.25) * (eta - 1) * (eta + 1) * (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);
    Sxi_xi_compact(23) = (0.0625) * (eta - 1) * (eta + 1) *
                         (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta) *
                         (m_thicknessZ - 2 * zoffset - thickness - thickness * zeta);
}